

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry_entries.cpp
# Opt level: O0

void __thiscall
ot::commissioner::persistent_storage::anon_unknown_0::JsonException::~JsonException
          (JsonException *this)

{
  JsonException *this_local;
  
  ~JsonException(this);
  operator_delete(this);
  return;
}

Assistant:

explicit JsonException(Error aError)
        : std::invalid_argument(aError.GetMessage())
        , mError(aError)
    {
    }